

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O0

bool __thiscall hwtest::pgraph::Register::scan_test(Register *this,int cnum,mt19937 *rnd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  string local_58 [8];
  string name_;
  uint32_t rall0;
  uint32_t rall1;
  uint32_t tmp;
  mt19937 *rnd_local;
  int cnum_local;
  Register *this_local;
  
  uVar1 = (*this->_vptr_Register[6])(this,(ulong)(uint)cnum);
  (*this->_vptr_Register[7])(this,(ulong)(uint)cnum,0xffffffff);
  uVar2 = (*this->_vptr_Register[6])(this,(ulong)(uint)cnum);
  (*this->_vptr_Register[7])(this,(ulong)(uint)cnum,0);
  uVar3 = (*this->_vptr_Register[6])(this,(ulong)(uint)cnum);
  (*this->_vptr_Register[7])(this,(ulong)(uint)cnum,(ulong)uVar1);
  (*this->_vptr_Register[2])(local_58);
  if ((uVar2 == (this->mask | this->fixed)) && (uVar3 == this->fixed)) {
    this_local._7_1_ = false;
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    printf("Bitscan mismatch for %s: is %08x/%08x, expected %08x/%08x\n",uVar4,(ulong)uVar2,
           (ulong)uVar3,(ulong)(this->mask | this->fixed));
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

virtual bool scan_test(int cnum, std::mt19937 &rnd) {
		uint32_t tmp = read(cnum);
		write(cnum, 0xffffffff);
		uint32_t rall1 = read(cnum);
		write(cnum, 0);
		uint32_t rall0 = read(cnum);
		write(cnum, tmp);
		std::string name_ = name();
		if (rall1 != (mask | fixed) || rall0 != fixed) {
			printf("Bitscan mismatch for %s: is %08x/%08x, expected %08x/%08x\n", name_.c_str(), rall1, rall0, mask | fixed, fixed);
			return true;
		}
		return false;
	}